

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O2

int remove_periodic_task(select_data_ptr sd,periodic_task_handle_conflict handle)

{
  pthread_t pVar1;
  periodic_task_handle_conflict p_Var2;
  periodic_task_handle_conflict p_Var3;
  periodic_task_handle *pp_Var4;
  pthread_t pVar5;
  
  p_Var2 = (periodic_task_handle_conflict)0x0;
  p_Var3 = sd->periodic_task_list;
  do {
    if (p_Var3 == handle) {
      pp_Var4 = &p_Var2->next;
      if (p_Var2 == (periodic_task_handle_conflict)0x0) {
        pp_Var4 = &sd->periodic_task_list;
      }
      *pp_Var4 = p_Var3->next;
      pVar5 = handle->executing;
      pVar1 = pthread_self();
      if (pVar5 != pVar1) {
        while (pVar5 != 0xffffffffffffffff) {
          sched_yield();
          pVar5 = handle->executing;
        }
      }
      free(handle);
      sd->select_consistency_number = sd->select_consistency_number + 1;
      return 1;
    }
    pp_Var4 = &p_Var3->next;
    p_Var2 = p_Var3;
    p_Var3 = *pp_Var4;
  } while (*pp_Var4 != (periodic_task_handle)0x0);
  return 0;
}

Assistant:

static int
remove_periodic_task(select_data_ptr sd, periodic_task_handle handle)
{
    periodic_task_handle list, last = NULL;
    list = sd->periodic_task_list;
    
    while(list != handle) {
	last = list;
	list = list->next;
	if (list == NULL) {
	    return 0;
	}
    }
    /* unlink task */
    if (last == NULL) {
	sd->periodic_task_list = list->next;
    } else {
	last->next = list->next;
    }
    if (handle->executing != thr_thread_self()) {
	/* someone besides us executing this ? */
        int i = 0;
	while (handle->executing != (thr_thread_t)-1) {
	    /* wait until they're done */
	    thr_thread_yield();
	    i++;
	    if (i > 1000) {
	        /* give up */
	        continue;
	    }
	}
    }
    free(handle);
    sd->select_consistency_number++;
    return 1;
}